

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

QDataStream * operator>>(QDataStream *in,QDate *date)

{
  ulong uVar1;
  long in_FS_OFFSET;
  quint32 jd;
  uint local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (in->ver < 0xd) {
    local_24 = 0xaaaaaaaa;
    QDataStream::operator>>(in,(qint32 *)&local_24);
    uVar1 = 0x8000000000000000;
    if ((ulong)local_24 != 0) {
      uVar1 = (ulong)local_24;
    }
    date->jd = uVar1;
  }
  else {
    QDataStream::operator>>(in,&date->jd);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return in;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &in, QDate &date)
{
    if (in.version() < QDataStream::Qt_5_0) {
        quint32 jd;
        in >> jd;
        // Older versions consider 0 an invalid jd.
        date.jd = (jd != 0 ? jd : QDate::nullJd());
    } else {
        in >> date.jd;
    }

    return in;
}